

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O0

void __thiscall ocmesh::details::obj::cube(obj *this,voxel v)

{
  iterator __first;
  iterator __last;
  __normal_iterator<glm::tvec3<float,_(glm::precision)0>_*,_std::vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>_>
  local_90;
  const_iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  array<glm::tvec3<float,_(glm::precision)0>,_8UL> c;
  obj *this_local;
  voxel v_local;
  
  c._M_elems[7]._4_8_ = this;
  this_local = (obj *)v._code;
  voxel::corners<glm::tvec3<float,(glm::precision)0>>
            ((array<glm::tvec3<float,_(glm::precision)0>,_8UL> *)local_78,(voxel *)&this_local);
  local_80 = std::
             vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
             ::size(&this->_vertices);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->_indexes,&local_80);
  local_90._M_current =
       (tvec3<float,_(glm::precision)0> *)
       std::
       vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
       ::end(&this->_vertices);
  __gnu_cxx::
  __normal_iterator<glm::tvec3<float,(glm::precision)0>const*,std::vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>>
  ::__normal_iterator<glm::tvec3<float,(glm::precision)0>*>
            ((__normal_iterator<glm::tvec3<float,(glm::precision)0>const*,std::vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>>
              *)&local_88,&local_90);
  __first = std::begin<std::array<glm::tvec3<float,(glm::precision)0>,8ul>>
                      ((array<glm::tvec3<float,_(glm::precision)0>,_8UL> *)local_78);
  __last = std::end<std::array<glm::tvec3<float,(glm::precision)0>,8ul>>
                     ((array<glm::tvec3<float,_(glm::precision)0>,_8UL> *)local_78);
  std::
  vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>::
  insert<glm::tvec3<float,(glm::precision)0>*,void>
            ((vector<glm::tvec3<float,(glm::precision)0>,std::allocator<glm::tvec3<float,(glm::precision)0>>>
              *)this,local_88,__first,__last);
  return;
}

Assistant:

void cube(voxel v) {
            auto c = v.corners<glm::vec3>();
            
            _indexes.push_back(_vertices.size());
            
            _vertices.insert(_vertices.end(), begin(c), end(c));
        }